

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

BBox3fa * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
         *this,size_t i)

{
  undefined1 auVar1 [16];
  uint uVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  char *pcVar4;
  size_t sVar5;
  byte bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar19;
  undefined1 auVar20 [32];
  ulong uVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  float fVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [64];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined4 uVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined4 uVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  
  pBVar3 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           vertices.items;
  uVar2 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                 super_CurveGeometry.field_0x68);
  pcVar4 = (pBVar3->super_RawBufferView).ptr_ofs;
  sVar5 = (pBVar3->super_RawBufferView).stride;
  auVar1 = *(undefined1 (*) [16])(pcVar4 + uVar2 * sVar5);
  lVar22 = (uVar2 + 1) * sVar5;
  auVar32 = *(undefined1 (*) [16])(pcVar4 + lVar22);
  lVar23 = (uVar2 + 2) * sVar5;
  auVar33 = *(undefined1 (*) [16])(pcVar4 + lVar23);
  lVar24 = (uVar2 + 3) * sVar5;
  auVar29 = *(undefined1 (*) [16])(pcVar4 + lVar24);
  fVar58 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           maxRadiusScale;
  fVar15 = fVar58 * *(float *)(pcVar4 + uVar2 * sVar5 + 0xc);
  fVar16 = fVar58 * *(float *)(pcVar4 + lVar22 + 0xc);
  fVar17 = fVar58 * *(float *)(pcVar4 + lVar23 + 0xc);
  fVar58 = fVar58 * *(float *)(pcVar4 + lVar24 + 0xc);
  lVar22 = (long)(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                 tessellationRate;
  uVar64 = auVar1._0_4_;
  uVar68 = auVar32._0_4_;
  if (lVar22 == 4) {
    auVar59._4_4_ = fVar17;
    auVar59._0_4_ = fVar17;
    auVar59._8_4_ = fVar17;
    auVar59._12_4_ = fVar17;
    auVar14 = vblendps_avx(auVar33,auVar59,8);
    auVar63._4_4_ = uVar64;
    auVar63._0_4_ = uVar64;
    auVar63._8_4_ = uVar64;
    auVar63._12_4_ = uVar64;
    auVar18 = vshufps_avx(auVar1,auVar1,0x55);
    auVar1 = vshufps_avx(auVar1,auVar1,0xaa);
    auVar65._4_4_ = fVar15;
    auVar65._0_4_ = fVar15;
    auVar65._8_4_ = fVar15;
    auVar65._12_4_ = fVar15;
    auVar71._4_4_ = uVar68;
    auVar71._0_4_ = uVar68;
    auVar71._8_4_ = uVar68;
    auVar71._12_4_ = uVar68;
    auVar31 = vshufps_avx(auVar32,auVar32,0x55);
    auVar32 = vshufps_avx(auVar32,auVar32,0xaa);
    auVar69._4_4_ = fVar16;
    auVar69._0_4_ = fVar16;
    auVar69._8_4_ = fVar16;
    auVar69._12_4_ = fVar16;
    auVar25 = vbroadcastss_avx512vl(auVar33);
    auVar26 = vshufps_avx512vl(auVar33,auVar33,0x55);
    auVar33 = vshufps_avx(auVar33,auVar33,0xaa);
    auVar27 = vbroadcastss_avx512vl(auVar29);
    auVar28 = vshufps_avx512vl(auVar29,auVar29,0x55);
    auVar29 = vshufps_avx(auVar29,auVar29,0xaa);
    auVar30._4_4_ = fVar58;
    auVar30._0_4_ = fVar58;
    auVar30._8_4_ = fVar58;
    auVar30._12_4_ = fVar58;
    auVar27 = vmulps_avx512vl(auVar27,catmullrom_basis0._3740_16_);
    auVar28 = vmulps_avx512vl(auVar28,catmullrom_basis0._3740_16_);
    auVar29 = vmulps_avx512vl(auVar29,catmullrom_basis0._3740_16_);
    auVar30 = vmulps_avx512vl(auVar30,catmullrom_basis0._3740_16_);
    auVar25 = vfmadd231ps_avx512vl(auVar27,catmullrom_basis0._2584_16_,auVar25);
    auVar26 = vfmadd231ps_avx512vl(auVar28,catmullrom_basis0._2584_16_,auVar26);
    auVar33 = vfmadd231ps_fma(auVar29,catmullrom_basis0._2584_16_,auVar33);
    auVar29 = vfmadd231ps_fma(auVar30,auVar59,catmullrom_basis0._2584_16_);
    auVar25 = vfmadd231ps_avx512vl(auVar25,catmullrom_basis0._1428_16_,auVar71);
    auVar31 = vfmadd231ps_avx512vl(auVar26,catmullrom_basis0._1428_16_,auVar31);
    auVar32 = vfmadd231ps_fma(auVar33,catmullrom_basis0._1428_16_,auVar32);
    auVar33 = vfmadd231ps_fma(auVar29,catmullrom_basis0._1428_16_,auVar69);
    auVar25 = vfmadd231ps_avx512vl(auVar25,catmullrom_basis0._272_16_,auVar63);
    auVar26 = vfmadd231ps_avx512vl(auVar31,catmullrom_basis0._272_16_,auVar18);
    auVar18 = vfmadd231ps_fma(auVar32,catmullrom_basis0._272_16_,auVar1);
    auVar31 = vfmadd231ps_fma(auVar33,catmullrom_basis0._272_16_,auVar65);
    auVar27 = vshufps_avx512vl(auVar25,auVar25,0xb1);
    auVar32 = vminps_avx512vl(auVar27,auVar25);
    auVar1 = vshufpd_avx(auVar32,auVar32,1);
    auVar1 = vminps_avx(auVar1,auVar32);
    auVar28 = vshufps_avx512vl(auVar26,auVar26,0xb1);
    auVar33 = vminps_avx512vl(auVar28,auVar26);
    auVar32 = vshufpd_avx(auVar33,auVar33,1);
    auVar32 = vminps_avx(auVar32,auVar33);
    auVar1 = vinsertps_avx(auVar1,auVar32,0x1c);
    auVar29 = vshufps_avx(auVar18,auVar18,0xb1);
    auVar32 = vminps_avx(auVar29,auVar18);
    auVar33 = vshufpd_avx(auVar32,auVar32,1);
    auVar32 = vminps_avx(auVar33,auVar32);
    auVar1 = vinsertps_avx(auVar1,auVar32,0x20);
    auVar33 = vmaxps_avx512vl(auVar27,auVar25);
    auVar32 = vshufpd_avx(auVar33,auVar33,1);
    auVar32 = vmaxps_avx(auVar32,auVar33);
    auVar25 = vmaxps_avx512vl(auVar28,auVar26);
    auVar33 = vshufpd_avx(auVar25,auVar25,1);
    auVar33 = vmaxps_avx(auVar33,auVar25);
    auVar32 = vinsertps_avx(auVar32,auVar33,0x1c);
    auVar33 = vmaxps_avx(auVar29,auVar18);
    auVar29 = vshufpd_avx(auVar33,auVar33,1);
    auVar33 = vmaxps_avx(auVar29,auVar33);
    auVar32 = vinsertps_avx(auVar32,auVar33,0x20);
    auVar18._8_4_ = 0x7fffffff;
    auVar18._0_8_ = 0x7fffffff7fffffff;
    auVar18._12_4_ = 0x7fffffff;
    auVar33 = vandps_avx512vl(auVar31,auVar18);
    auVar29 = vprolq_avx512vl(auVar33,0x20);
    auVar33 = vmaxps_avx(auVar29,auVar33);
    uVar64 = auVar33._0_4_;
    auVar31._4_4_ = uVar64;
    auVar31._0_4_ = uVar64;
    auVar31._8_4_ = uVar64;
    auVar31._12_4_ = uVar64;
    auVar33 = vshufps_avx(auVar33,auVar33,0xaa);
    auVar33 = vmaxps_avx(auVar33,auVar31);
    auVar1 = vminps_avx(auVar1,auVar14);
    auVar32 = vmaxps_avx(auVar32,auVar14);
    auVar14._8_4_ = 0x7fffffff;
    auVar14._0_8_ = 0x7fffffff7fffffff;
    auVar14._12_4_ = 0x7fffffff;
    auVar29 = vandps_avx512vl(auVar59,auVar14);
    auVar29 = vmaxps_avx(auVar33,auVar29);
    auVar1 = vsubps_avx(auVar1,auVar29);
    auVar33._0_4_ = auVar32._0_4_ + auVar29._0_4_;
    auVar33._4_4_ = auVar32._4_4_ + auVar29._4_4_;
    auVar33._8_4_ = auVar32._8_4_ + auVar29._8_4_;
    auVar33._12_4_ = auVar32._12_4_ + auVar29._12_4_;
  }
  else {
    auVar34 = vpbroadcastd_avx512vl();
    auVar62._4_4_ = uVar64;
    auVar62._0_4_ = uVar64;
    auVar62._8_4_ = uVar64;
    auVar62._12_4_ = uVar64;
    auVar62._16_4_ = uVar64;
    auVar62._20_4_ = uVar64;
    auVar62._24_4_ = uVar64;
    auVar62._28_4_ = uVar64;
    auVar54._8_4_ = 1;
    auVar54._0_8_ = 0x100000001;
    auVar54._12_4_ = 1;
    auVar54._16_4_ = 1;
    auVar54._20_4_ = 1;
    auVar54._24_4_ = 1;
    auVar54._28_4_ = 1;
    auVar56 = vpermps_avx2(auVar54,ZEXT1632(auVar1));
    auVar35 = vbroadcastss_avx512vl(ZEXT416(2));
    auVar36 = vpermps_avx512vl(auVar35,ZEXT1632(auVar1));
    auVar66._4_4_ = fVar15;
    auVar66._0_4_ = fVar15;
    auVar66._8_4_ = fVar15;
    auVar66._12_4_ = fVar15;
    auVar66._16_4_ = fVar15;
    auVar66._20_4_ = fVar15;
    auVar66._24_4_ = fVar15;
    auVar66._28_4_ = fVar15;
    auVar67._4_4_ = uVar68;
    auVar67._0_4_ = uVar68;
    auVar67._8_4_ = uVar68;
    auVar67._12_4_ = uVar68;
    auVar67._16_4_ = uVar68;
    auVar67._20_4_ = uVar68;
    auVar67._24_4_ = uVar68;
    auVar67._28_4_ = uVar68;
    auVar57 = vpermps_avx2(auVar54,ZEXT1632(auVar32));
    auVar37 = vpermps_avx512vl(auVar35,ZEXT1632(auVar32));
    auVar70._4_4_ = fVar16;
    auVar70._0_4_ = fVar16;
    auVar70._8_4_ = fVar16;
    auVar70._12_4_ = fVar16;
    auVar70._16_4_ = fVar16;
    auVar70._20_4_ = fVar16;
    auVar70._24_4_ = fVar16;
    auVar70._28_4_ = fVar16;
    uVar64 = auVar33._0_4_;
    auVar72._4_4_ = uVar64;
    auVar72._0_4_ = uVar64;
    auVar72._8_4_ = uVar64;
    auVar72._12_4_ = uVar64;
    auVar72._16_4_ = uVar64;
    auVar72._20_4_ = uVar64;
    auVar72._24_4_ = uVar64;
    auVar72._28_4_ = uVar64;
    auVar20 = vpermps_avx2(auVar54,ZEXT1632(auVar33));
    auVar38 = vpermps_avx512vl(auVar35,ZEXT1632(auVar33));
    auVar39 = vbroadcastss_avx512vl(ZEXT416((uint)fVar17));
    auVar40 = vbroadcastss_avx512vl(auVar29);
    auVar41 = vpermps_avx512vl(auVar54,ZEXT1632(auVar29));
    auVar42 = vpermps_avx512vl(auVar35,ZEXT1632(auVar29));
    auVar43 = vbroadcastss_avx512vl(ZEXT416((uint)fVar58));
    lVar23 = lVar22 * 0x44;
    auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
    auVar35._8_4_ = 0xff800000;
    auVar35._0_8_ = 0xff800000ff800000;
    auVar35._12_4_ = 0xff800000;
    auVar35._16_4_ = 0xff800000;
    auVar35._20_4_ = 0xff800000;
    auVar35._24_4_ = 0xff800000;
    auVar35._28_4_ = 0xff800000;
    auVar61 = ZEXT864(0);
    lVar24 = 0;
    auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar54 = auVar35;
    auVar55 = auVar35;
    auVar52 = auVar44;
    auVar53 = auVar44;
    for (; auVar60 = auVar61._0_32_, lVar24 <= lVar22; lVar24 = lVar24 + 8) {
      auVar46 = vpbroadcastd_avx512vl();
      auVar46 = vpord_avx512vl(auVar46,_DAT_01fb4ba0);
      uVar21 = vpcmpgtd_avx512vl(auVar46,auVar34);
      auVar46 = *(undefined1 (*) [32])(lVar23 + 0x2204c74 + lVar24 * 4);
      auVar50 = *(undefined1 (*) [32])(lVar23 + 0x22050f8 + lVar24 * 4);
      auVar47 = vmulps_avx512vl(auVar40,auVar50);
      auVar48 = vmulps_avx512vl(auVar41,auVar50);
      auVar49 = vmulps_avx512vl(auVar42,auVar50);
      auVar50 = vmulps_avx512vl(auVar43,auVar50);
      auVar47 = vfmadd231ps_avx512vl(auVar47,auVar46,auVar72);
      auVar48 = vfmadd231ps_avx512vl(auVar48,auVar46,auVar20);
      auVar49 = vfmadd231ps_avx512vl(auVar49,auVar46,auVar38);
      auVar50 = vfmadd231ps_avx512vl(auVar50,auVar39,auVar46);
      auVar46 = *(undefined1 (*) [32])(lVar23 + 0x22047f0 + lVar24 * 4);
      auVar47 = vfmadd231ps_avx512vl(auVar47,auVar46,auVar67);
      auVar48 = vfmadd231ps_avx512vl(auVar48,auVar46,auVar57);
      auVar49 = vfmadd231ps_avx512vl(auVar49,auVar46,auVar37);
      auVar50 = vfmadd231ps_avx512vl(auVar50,auVar70,auVar46);
      auVar46 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 * 4 + lVar23);
      auVar47 = vfmadd231ps_avx512vl(auVar47,auVar46,auVar62);
      auVar48 = vfmadd231ps_avx512vl(auVar48,auVar46,auVar56);
      auVar49 = vfmadd231ps_avx512vl(auVar49,auVar46,auVar36);
      auVar46 = vfmadd231ps_avx512vl(auVar50,auVar66,auVar46);
      auVar50 = vminps_avx512vl(auVar52,auVar47);
      bVar6 = (byte)uVar21;
      auVar51._0_4_ = (uint)(bVar6 & 1) * auVar52._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar50._0_4_;
      bVar7 = (bool)((byte)(uVar21 >> 1) & 1);
      auVar51._4_4_ = (uint)bVar7 * auVar52._4_4_ | (uint)!bVar7 * auVar50._4_4_;
      bVar7 = (bool)((byte)(uVar21 >> 2) & 1);
      auVar51._8_4_ = (uint)bVar7 * auVar52._8_4_ | (uint)!bVar7 * auVar50._8_4_;
      bVar7 = (bool)((byte)(uVar21 >> 3) & 1);
      auVar51._12_4_ = (uint)bVar7 * auVar52._12_4_ | (uint)!bVar7 * auVar50._12_4_;
      bVar7 = (bool)((byte)(uVar21 >> 4) & 1);
      auVar51._16_4_ = (uint)bVar7 * auVar52._16_4_ | (uint)!bVar7 * auVar50._16_4_;
      bVar7 = (bool)((byte)(uVar21 >> 5) & 1);
      auVar51._20_4_ = (uint)bVar7 * auVar52._20_4_ | (uint)!bVar7 * auVar50._20_4_;
      bVar7 = (bool)((byte)(uVar21 >> 6) & 1);
      auVar51._24_4_ = (uint)bVar7 * auVar52._24_4_ | (uint)!bVar7 * auVar50._24_4_;
      bVar7 = SUB81(uVar21 >> 7,0);
      auVar51._28_4_ = (uint)bVar7 * auVar52._28_4_ | (uint)!bVar7 * auVar50._28_4_;
      auVar52 = vminps_avx512vl(auVar53,auVar48);
      auVar50._0_4_ = (uint)(bVar6 & 1) * auVar53._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar52._0_4_;
      bVar7 = (bool)((byte)(uVar21 >> 1) & 1);
      auVar50._4_4_ = (uint)bVar7 * auVar53._4_4_ | (uint)!bVar7 * auVar52._4_4_;
      bVar7 = (bool)((byte)(uVar21 >> 2) & 1);
      auVar50._8_4_ = (uint)bVar7 * auVar53._8_4_ | (uint)!bVar7 * auVar52._8_4_;
      bVar7 = (bool)((byte)(uVar21 >> 3) & 1);
      auVar50._12_4_ = (uint)bVar7 * auVar53._12_4_ | (uint)!bVar7 * auVar52._12_4_;
      bVar7 = (bool)((byte)(uVar21 >> 4) & 1);
      auVar50._16_4_ = (uint)bVar7 * auVar53._16_4_ | (uint)!bVar7 * auVar52._16_4_;
      bVar7 = (bool)((byte)(uVar21 >> 5) & 1);
      auVar50._20_4_ = (uint)bVar7 * auVar53._20_4_ | (uint)!bVar7 * auVar52._20_4_;
      bVar7 = (bool)((byte)(uVar21 >> 6) & 1);
      auVar50._24_4_ = (uint)bVar7 * auVar53._24_4_ | (uint)!bVar7 * auVar52._24_4_;
      bVar7 = SUB81(uVar21 >> 7,0);
      auVar50._28_4_ = (uint)bVar7 * auVar53._28_4_ | (uint)!bVar7 * auVar52._28_4_;
      auVar53 = vminps_avx512vl(auVar44,auVar49);
      auVar52._0_4_ = (uint)(bVar6 & 1) * auVar44._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar53._0_4_;
      bVar7 = (bool)((byte)(uVar21 >> 1) & 1);
      auVar52._4_4_ = (uint)bVar7 * auVar44._4_4_ | (uint)!bVar7 * auVar53._4_4_;
      bVar7 = (bool)((byte)(uVar21 >> 2) & 1);
      auVar52._8_4_ = (uint)bVar7 * auVar44._8_4_ | (uint)!bVar7 * auVar53._8_4_;
      bVar7 = (bool)((byte)(uVar21 >> 3) & 1);
      auVar52._12_4_ = (uint)bVar7 * auVar44._12_4_ | (uint)!bVar7 * auVar53._12_4_;
      bVar7 = (bool)((byte)(uVar21 >> 4) & 1);
      auVar52._16_4_ = (uint)bVar7 * auVar44._16_4_ | (uint)!bVar7 * auVar53._16_4_;
      bVar7 = (bool)((byte)(uVar21 >> 5) & 1);
      auVar52._20_4_ = (uint)bVar7 * auVar44._20_4_ | (uint)!bVar7 * auVar53._20_4_;
      bVar7 = (bool)((byte)(uVar21 >> 6) & 1);
      auVar52._24_4_ = (uint)bVar7 * auVar44._24_4_ | (uint)!bVar7 * auVar53._24_4_;
      bVar7 = SUB81(uVar21 >> 7,0);
      auVar52._28_4_ = (uint)bVar7 * auVar44._28_4_ | (uint)!bVar7 * auVar53._28_4_;
      auVar53 = vmaxps_avx512vl(auVar54,auVar47);
      auVar44._0_4_ = (uint)(bVar6 & 1) * auVar54._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar53._0_4_;
      bVar7 = (bool)((byte)(uVar21 >> 1) & 1);
      auVar44._4_4_ = (uint)bVar7 * auVar54._4_4_ | (uint)!bVar7 * auVar53._4_4_;
      bVar7 = (bool)((byte)(uVar21 >> 2) & 1);
      auVar44._8_4_ = (uint)bVar7 * auVar54._8_4_ | (uint)!bVar7 * auVar53._8_4_;
      bVar7 = (bool)((byte)(uVar21 >> 3) & 1);
      auVar44._12_4_ = (uint)bVar7 * auVar54._12_4_ | (uint)!bVar7 * auVar53._12_4_;
      bVar7 = (bool)((byte)(uVar21 >> 4) & 1);
      auVar44._16_4_ = (uint)bVar7 * auVar54._16_4_ | (uint)!bVar7 * auVar53._16_4_;
      bVar7 = (bool)((byte)(uVar21 >> 5) & 1);
      auVar44._20_4_ = (uint)bVar7 * auVar54._20_4_ | (uint)!bVar7 * auVar53._20_4_;
      bVar7 = (bool)((byte)(uVar21 >> 6) & 1);
      auVar44._24_4_ = (uint)bVar7 * auVar54._24_4_ | (uint)!bVar7 * auVar53._24_4_;
      bVar7 = SUB81(uVar21 >> 7,0);
      auVar44._28_4_ = (uint)bVar7 * auVar54._28_4_ | (uint)!bVar7 * auVar53._28_4_;
      auVar54 = vmaxps_avx512vl(auVar55,auVar48);
      auVar53._0_4_ = (uint)(bVar6 & 1) * auVar55._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar54._0_4_;
      bVar7 = (bool)((byte)(uVar21 >> 1) & 1);
      auVar53._4_4_ = (uint)bVar7 * auVar55._4_4_ | (uint)!bVar7 * auVar54._4_4_;
      bVar7 = (bool)((byte)(uVar21 >> 2) & 1);
      auVar53._8_4_ = (uint)bVar7 * auVar55._8_4_ | (uint)!bVar7 * auVar54._8_4_;
      bVar7 = (bool)((byte)(uVar21 >> 3) & 1);
      auVar53._12_4_ = (uint)bVar7 * auVar55._12_4_ | (uint)!bVar7 * auVar54._12_4_;
      bVar7 = (bool)((byte)(uVar21 >> 4) & 1);
      auVar53._16_4_ = (uint)bVar7 * auVar55._16_4_ | (uint)!bVar7 * auVar54._16_4_;
      bVar7 = (bool)((byte)(uVar21 >> 5) & 1);
      auVar53._20_4_ = (uint)bVar7 * auVar55._20_4_ | (uint)!bVar7 * auVar54._20_4_;
      bVar7 = (bool)((byte)(uVar21 >> 6) & 1);
      auVar53._24_4_ = (uint)bVar7 * auVar55._24_4_ | (uint)!bVar7 * auVar54._24_4_;
      bVar7 = SUB81(uVar21 >> 7,0);
      auVar53._28_4_ = (uint)bVar7 * auVar55._28_4_ | (uint)!bVar7 * auVar54._28_4_;
      auVar54 = vmaxps_avx512vl(auVar35,auVar49);
      auVar55._0_4_ = (uint)(bVar6 & 1) * auVar35._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar54._0_4_;
      bVar7 = (bool)((byte)(uVar21 >> 1) & 1);
      auVar55._4_4_ = (uint)bVar7 * auVar35._4_4_ | (uint)!bVar7 * auVar54._4_4_;
      bVar7 = (bool)((byte)(uVar21 >> 2) & 1);
      auVar55._8_4_ = (uint)bVar7 * auVar35._8_4_ | (uint)!bVar7 * auVar54._8_4_;
      bVar7 = (bool)((byte)(uVar21 >> 3) & 1);
      auVar55._12_4_ = (uint)bVar7 * auVar35._12_4_ | (uint)!bVar7 * auVar54._12_4_;
      bVar7 = (bool)((byte)(uVar21 >> 4) & 1);
      auVar55._16_4_ = (uint)bVar7 * auVar35._16_4_ | (uint)!bVar7 * auVar54._16_4_;
      bVar7 = (bool)((byte)(uVar21 >> 5) & 1);
      auVar55._20_4_ = (uint)bVar7 * auVar35._20_4_ | (uint)!bVar7 * auVar54._20_4_;
      bVar7 = (bool)((byte)(uVar21 >> 6) & 1);
      auVar55._24_4_ = (uint)bVar7 * auVar35._24_4_ | (uint)!bVar7 * auVar54._24_4_;
      bVar7 = SUB81(uVar21 >> 7,0);
      auVar55._28_4_ = (uint)bVar7 * auVar35._28_4_ | (uint)!bVar7 * auVar54._28_4_;
      vandps_avx512vl(auVar46,auVar45);
      auVar35 = vmaxps_avx(auVar60,auVar55);
      bVar7 = (bool)((byte)(uVar21 >> 1) & 1);
      bVar8 = (bool)((byte)(uVar21 >> 2) & 1);
      bVar9 = (bool)((byte)(uVar21 >> 3) & 1);
      bVar10 = (bool)((byte)(uVar21 >> 4) & 1);
      bVar11 = (bool)((byte)(uVar21 >> 5) & 1);
      bVar12 = (bool)((byte)(uVar21 >> 6) & 1);
      bVar13 = SUB81(uVar21 >> 7,0);
      auVar61 = ZEXT3264(CONCAT428((uint)bVar13 * auVar61._28_4_ | (uint)!bVar13 * auVar35._28_4_,
                                   CONCAT424((uint)bVar12 * auVar61._24_4_ |
                                             (uint)!bVar12 * auVar35._24_4_,
                                             CONCAT420((uint)bVar11 * auVar61._20_4_ |
                                                       (uint)!bVar11 * auVar35._20_4_,
                                                       CONCAT416((uint)bVar10 * auVar61._16_4_ |
                                                                 (uint)!bVar10 * auVar35._16_4_,
                                                                 CONCAT412((uint)bVar9 *
                                                                           auVar61._12_4_ |
                                                                           (uint)!bVar9 *
                                                                           auVar35._12_4_,
                                                                           CONCAT48((uint)bVar8 *
                                                                                    auVar61._8_4_ |
                                                                                    (uint)!bVar8 *
                                                                                    auVar35._8_4_,
                                                                                    CONCAT44((uint)
                                                  bVar7 * auVar61._4_4_ |
                                                  (uint)!bVar7 * auVar35._4_4_,
                                                  (uint)(bVar6 & 1) * auVar61._0_4_ |
                                                  (uint)!(bool)(bVar6 & 1) * auVar35._0_4_))))))));
      auVar35 = auVar55;
      auVar54 = auVar44;
      auVar55 = auVar53;
      auVar44 = auVar52;
      auVar52 = auVar51;
      auVar53 = auVar50;
    }
    auVar56 = vshufps_avx512vl(auVar52,auVar52,0xb1);
    auVar57 = vminps_avx512vl(auVar52,auVar56);
    auVar56 = vshufpd_avx(auVar57,auVar57,5);
    auVar56 = vminps_avx(auVar57,auVar56);
    auVar1 = vminps_avx(auVar56._0_16_,auVar56._16_16_);
    auVar56 = vshufps_avx512vl(auVar53,auVar53,0xb1);
    auVar57 = vminps_avx512vl(auVar53,auVar56);
    auVar56 = vshufpd_avx(auVar57,auVar57,5);
    auVar56 = vminps_avx(auVar57,auVar56);
    auVar32 = vminps_avx(auVar56._0_16_,auVar56._16_16_);
    auVar32 = vunpcklps_avx(auVar1,auVar32);
    auVar56 = vshufps_avx512vl(auVar44,auVar44,0xb1);
    auVar57 = vminps_avx512vl(auVar44,auVar56);
    auVar56 = vshufpd_avx(auVar57,auVar57,5);
    auVar56 = vminps_avx(auVar57,auVar56);
    auVar1 = vminps_avx(auVar56._0_16_,auVar56._16_16_);
    auVar1 = vinsertps_avx(auVar32,auVar1,0x28);
    auVar56 = vshufps_avx(auVar54,auVar54,0xb1);
    auVar56 = vmaxps_avx(auVar54,auVar56);
    auVar57 = vshufpd_avx(auVar56,auVar56,5);
    auVar56 = vmaxps_avx(auVar56,auVar57);
    auVar32 = vmaxps_avx(auVar56._0_16_,auVar56._16_16_);
    auVar56 = vshufps_avx(auVar55,auVar55,0xb1);
    auVar56 = vmaxps_avx(auVar55,auVar56);
    auVar57 = vshufpd_avx(auVar56,auVar56,5);
    auVar56 = vmaxps_avx(auVar56,auVar57);
    auVar33 = vmaxps_avx(auVar56._0_16_,auVar56._16_16_);
    auVar33 = vunpcklps_avx(auVar32,auVar33);
    auVar56 = vshufps_avx(auVar35,auVar35,0xb1);
    auVar56 = vmaxps_avx(auVar35,auVar56);
    auVar57 = vshufpd_avx(auVar56,auVar56,5);
    auVar56 = vmaxps_avx(auVar56,auVar57);
    auVar32 = vmaxps_avx(auVar56._0_16_,auVar56._16_16_);
    auVar32 = vinsertps_avx(auVar33,auVar32,0x28);
    auVar56 = vshufps_avx(auVar60,auVar60,0xb1);
    auVar56 = vmaxps_avx(auVar60,auVar56);
    auVar57 = vshufpd_avx(auVar56,auVar56,5);
    auVar56 = vmaxps_avx(auVar56,auVar57);
    auVar33 = vmaxps_avx(auVar56._0_16_,auVar56._16_16_);
    fVar58 = auVar33._0_4_;
    auVar29._4_4_ = fVar58;
    auVar29._0_4_ = fVar58;
    auVar29._8_4_ = fVar58;
    auVar29._12_4_ = fVar58;
    auVar1 = vsubps_avx(auVar1,auVar29);
    auVar33._0_4_ = auVar32._0_4_ + fVar58;
    auVar33._4_4_ = auVar32._4_4_ + fVar58;
    auVar33._8_4_ = auVar32._8_4_ + fVar58;
    auVar33._12_4_ = auVar32._12_4_ + fVar58;
  }
  auVar25._8_4_ = 0x7fffffff;
  auVar25._0_8_ = 0x7fffffff7fffffff;
  auVar25._12_4_ = 0x7fffffff;
  auVar32 = vandps_avx(auVar1,auVar25);
  auVar29 = vandps_avx(auVar33,auVar25);
  auVar32 = vmaxps_avx(auVar32,auVar29);
  auVar29 = vmovshdup_avx(auVar32);
  auVar29 = vmaxss_avx(auVar29,auVar32);
  auVar32 = vshufpd_avx(auVar32,auVar32,1);
  auVar32 = vmaxss_avx(auVar32,auVar29);
  fVar58 = auVar32._0_4_ * 4.7683716e-07;
  auVar32._4_4_ = fVar58;
  auVar32._0_4_ = fVar58;
  auVar32._8_4_ = fVar58;
  auVar32._12_4_ = fVar58;
  aVar19 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar1,auVar32);
  (__return_storage_ptr__->lower).field_0 = aVar19;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar33._0_4_ + fVar58;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar33._4_4_ + fVar58;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar33._8_4_ + fVar58;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar33._12_4_ + fVar58;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(size_t i) const {
        return bounds(i);
      }